

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeCommandListAppendLaunchKernelPrologue
          (ZEHandleLifetimeValidation *this,ze_command_list_handle_t hCommandList,
          ze_kernel_handle_t hKernel,ze_group_count_t *pLaunchFuncArgs,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  long lVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  iterator iVar5;
  ulong uVar6;
  ze_command_list_handle_t local_38;
  
  lVar1 = context;
  local_38 = hCommandList;
  iVar2 = std::
          _Hashtable<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(context + 0xd48) + 0x130),&local_38);
  if (iVar2.
      super__Node_iterator_base<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_38 = hCommandList;
    pmVar3 = std::__detail::
             _Map_base<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<_ze_command_list_handle_t_*,_std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_command_list_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_command_list_handle_t_*>,_std::hash<_ze_command_list_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(*(long *)(lVar1 + 0xd48) + 0x130),&local_38);
    if (((pmVar3->_M_t).
         super___uniq_ptr_impl<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>
         ._M_t.
         super__Tuple_impl<0UL,_validation_layer::_zel_handle_state_t_*,_std::default_delete<validation_layer::_zel_handle_state_t>_>
         .super__Head_base<0UL,_validation_layer::_zel_handle_state_t_*,_false>._M_head_impl)->
        is_open != true) {
      return ZE_RESULT_ERROR_INVALID_ARGUMENT;
    }
    local_38 = (ze_command_list_handle_t)hKernel;
    iVar4 = std::
            _Hashtable<_ze_kernel_handle_t_*,_std::pair<_ze_kernel_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_kernel_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_kernel_handle_t_*>,_std::hash<_ze_kernel_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<_ze_kernel_handle_t_*,_std::pair<_ze_kernel_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_kernel_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_kernel_handle_t_*>,_std::hash<_ze_kernel_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(*(long *)(lVar1 + 0xd48) + 0x2b8),(key_type *)&local_38);
    if ((iVar4.
         super__Node_iterator_base<std::pair<_ze_kernel_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
         ._M_cur != (__node_type *)0x0) &&
       ((hSignalEvent == (ze_event_handle_t)0x0 ||
        (local_38 = (ze_command_list_handle_t)hSignalEvent,
        iVar5 = std::
                _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(*(long *)(lVar1 + 0xd48) + 0x1d8),(key_type *)&local_38),
        iVar5.
        super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
        ._M_cur != (__node_type *)0x0)))) {
      if (numWaitEvents != 0 && phWaitEvents != (ze_event_handle_t *)0x0) {
        uVar6 = 0;
        do {
          local_38 = (ze_command_list_handle_t)phWaitEvents[uVar6];
          iVar5 = std::
                  _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)(*(long *)(lVar1 + 0xd48) + 0x1d8),(key_type *)&local_38);
          if (iVar5.
              super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < numWaitEvents);
      }
      return ZE_RESULT_SUCCESS;
    }
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeCommandListAppendLaunchKernelPrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        const ze_group_count_t* pLaunchFuncArgs,        ///< [in] thread group launch arguments
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hCommandList )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (!context.handleLifetime->isOpen( hCommandList )){
            return ZE_RESULT_ERROR_INVALID_ARGUMENT;
        }
        if ( !context.handleLifetime->isHandleValid( hKernel )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if (hSignalEvent && !context.handleLifetime->isHandleValid( hSignalEvent )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        for (size_t i = 0; ( nullptr != phWaitEvents) && (i < numWaitEvents); ++i){
            if (!context.handleLifetime->isHandleValid( phWaitEvents[i] )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
            }
        }
        return ZE_RESULT_SUCCESS;
    }